

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Bytes __thiscall Omega_h::each_gt<signed_char>(Omega_h *this,Read<signed_char> *a,char b)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  LO LVar2;
  Bytes BVar3;
  Write<signed_char> c;
  type f;
  allocator local_69;
  Write<signed_char> local_68;
  type local_58;
  Write<signed_char> local_30;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    LVar2 = (LO)pAVar1->size;
  }
  else {
    LVar2 = (LO)((ulong)pAVar1 >> 3);
  }
  std::__cxx11::string::string((string *)&local_58,"",&local_69);
  Write<signed_char>::Write(&local_68,LVar2,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  Write<signed_char>::Write(&local_58.c,&local_68);
  Write<signed_char>::Write(&local_58.a.write_,&a->write_);
  if (((ulong)local_68.shared_alloc_.alloc & 1) == 0) {
    LVar2 = (LO)(local_68.shared_alloc_.alloc)->size;
  }
  else {
    LVar2 = (LO)((ulong)local_68.shared_alloc_.alloc >> 3);
  }
  local_58.b = b;
  parallel_for<Omega_h::each_gt<signed_char>(Omega_h::Read<signed_char>,signed_char)::_lambda(int)_1_>
            (LVar2,&local_58,"each_gt");
  Write<signed_char>::Write(&local_30,&local_68);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_30);
  Write<signed_char>::~Write(&local_30);
  each_gt<signed_char>(Omega_h::Read<signed_char>,signed_char)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)&local_58);
  Write<signed_char>::~Write(&local_68);
  BVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  BVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Bytes)BVar3.write_.shared_alloc_;
}

Assistant:

Bytes each_gt(Read<T> a, T b) {
  Write<I8> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = (a[i] > b); };
  parallel_for(c.size(), f, "each_gt");
  return c;
}